

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlNodeSimulate(Fra_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_48;
  int i;
  int fCompl1;
  int fCompl0;
  int fCompl;
  uint *pSims1;
  uint *pSims0;
  uint *pSims;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Fra_Sml_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x1e9,"void Fra_SmlNodeSimulate(Fra_Sml_t *, Aig_Obj_t *, int)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x1ea,"void Fra_SmlNodeSimulate(Fra_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((iFrame != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
    __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x1eb,"void Fra_SmlNodeSimulate(Fra_Sml_t *, Aig_Obj_t *, int)");
  }
  puVar3 = Fra_ObjSim(p,pObj->Id);
  iVar8 = p->nWordsFrame * iFrame;
  pAVar4 = Aig_ObjFanin0(pObj);
  puVar5 = Fra_ObjSim(p,pAVar4->Id);
  iVar9 = p->nWordsFrame * iFrame;
  pAVar4 = Aig_ObjFanin1(pObj);
  puVar6 = Fra_ObjSim(p,pAVar4->Id);
  iVar10 = p->nWordsFrame * iFrame;
  uVar7 = *(ulong *)&pObj->field_0x18 >> 3;
  pAVar4 = Aig_ObjChild0(pObj);
  iVar1 = Aig_ObjPhaseReal(pAVar4);
  pAVar4 = Aig_ObjChild1(pObj);
  iVar2 = Aig_ObjPhaseReal(pAVar4);
  if ((iVar1 == 0) || (iVar2 == 0)) {
    if ((iVar1 == 0) || (iVar2 != 0)) {
      if ((iVar1 == 0) && (iVar2 != 0)) {
        if ((uVar7 & 1) == 0) {
          for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
            puVar3[(long)iVar8 + (long)local_48] =
                 puVar5[(long)iVar9 + (long)local_48] &
                 (puVar6[(long)iVar10 + (long)local_48] ^ 0xffffffff);
          }
        }
        else {
          for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
            puVar3[(long)iVar8 + (long)local_48] =
                 puVar5[(long)iVar9 + (long)local_48] ^ 0xffffffff |
                 puVar6[(long)iVar10 + (long)local_48];
          }
        }
      }
      else if ((uVar7 & 1) == 0) {
        for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
          puVar3[(long)iVar8 + (long)local_48] =
               puVar5[(long)iVar9 + (long)local_48] & puVar6[(long)iVar10 + (long)local_48];
        }
      }
      else {
        for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
          puVar3[(long)iVar8 + (long)local_48] =
               puVar5[(long)iVar9 + (long)local_48] & puVar6[(long)iVar10 + (long)local_48] ^
               0xffffffff;
        }
      }
    }
    else if ((uVar7 & 1) == 0) {
      for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
        puVar3[(long)iVar8 + (long)local_48] =
             (puVar5[(long)iVar9 + (long)local_48] ^ 0xffffffff) &
             puVar6[(long)iVar10 + (long)local_48];
      }
    }
    else {
      for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
        puVar3[(long)iVar8 + (long)local_48] =
             puVar5[(long)iVar9 + (long)local_48] |
             puVar6[(long)iVar10 + (long)local_48] ^ 0xffffffff;
      }
    }
  }
  else if ((uVar7 & 1) == 0) {
    for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
      puVar3[(long)iVar8 + (long)local_48] =
           (puVar5[(long)iVar9 + (long)local_48] | puVar6[(long)iVar10 + (long)local_48]) ^
           0xffffffff;
    }
  }
  else {
    for (local_48 = 0; local_48 < p->nWordsFrame; local_48 = local_48 + 1) {
      puVar3[(long)iVar8 + (long)local_48] =
           puVar5[(long)iVar9 + (long)local_48] | puVar6[(long)iVar10 + (long)local_48];
    }
  }
  return;
}

Assistant:

void Fra_SmlNodeSimulate( Fra_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims, * pSims0, * pSims1;
    int fCompl, fCompl0, fCompl1, i;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims  = Fra_ObjSim(p, pObj->Id) + p->nWordsFrame * iFrame;
    pSims0 = Fra_ObjSim(p, Aig_ObjFanin0(pObj)->Id) + p->nWordsFrame * iFrame;
    pSims1 = Fra_ObjSim(p, Aig_ObjFanin1(pObj)->Id) + p->nWordsFrame * iFrame;
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Aig_ObjPhaseReal(Aig_ObjChild0(pObj));
    fCompl1 = Aig_ObjPhaseReal(Aig_ObjChild1(pObj));
    // simulate
    if ( fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] | pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = ~(pSims0[i] | pSims1[i]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] | ~pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (~pSims0[i] & pSims1[i]);
    }
    else if ( !fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (~pSims0[i] | pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] & ~pSims1[i]);
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = ~(pSims0[i] & pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] & pSims1[i]);
    }
}